

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O3

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CArgument *stm)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  CType *pCVar3;
  CIdExp *pCVar4;
  VariableInfo *pVVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  shared_ptr<TypeInfo> local_38;
  VariableInfo *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pCVar3 = (stm->type)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
           super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
           super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  if (pCVar3 != (CType *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar3->super_IWrapper).super_PositionedNode)();
  }
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar1->iName,0,(char *)(peVar1->iName)._M_string_length,0x15a41a);
  pCVar4 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar4 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar4->super_IExpression).super_PositionedNode)(pCVar4,this);
  }
  local_28 = (VariableInfo *)operator_new(0x38);
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar1->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  VariableInfo::VariableInfo(local_28,&peVar1->iName,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VariableInfo*>
            (&_Stack_20,local_28);
  _Var6._M_pi = _Stack_20._M_pi;
  pVVar5 = local_28;
  peVar1 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28 = (VariableInfo *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (peVar1->iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (peVar1->iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pVVar5;
  (peVar1->iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var6._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  if (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CArgument &stm )
{
//	std::cout << "arg\n";
	info->iType = nullptr;
	if( stm.type ) {
		stm.type->Accept( *this );
	}
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iVariable = std::shared_ptr<VariableInfo>( new VariableInfo( info->iName, info->iType ) );
}